

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O2

void __thiscall QCryptographicHash::QCryptographicHash(QCryptographicHash *this,Algorithm method)

{
  QCryptographicHashPrivate *this_00;
  
  this_00 = (QCryptographicHashPrivate *)operator_new(0x1f0);
  QCryptographicHashPrivate::QCryptographicHashPrivate(this_00,method);
  *(QCryptographicHashPrivate **)this = this_00;
  return;
}

Assistant:

QCryptographicHash::QCryptographicHash(Algorithm method)
    : d(new QCryptographicHashPrivate{method})
{
}